

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

GPU_Renderer * GPU_CreateRenderer(GPU_RendererID id)

{
  GPU_RendererID GVar1;
  char *in_stack_00000008;
  int local_14;
  GPU_Renderer *pGStack_10;
  int i;
  GPU_Renderer *result;
  
  pGStack_10 = (GPU_Renderer *)0x0;
  local_14 = 0;
  do {
    if (9 < local_14) {
LAB_0013b53d:
      if (pGStack_10 == (GPU_Renderer *)0x0) {
        GPU_PushErrorCode("GPU_CreateRenderer",GPU_ERROR_DATA_ERROR,
                          "Renderer was not found in the renderer registry.");
      }
      return pGStack_10;
    }
    if ((_gpu_renderer_register[local_14].id.renderer != 0) &&
       ((GPU_RendererEnum)id.name == _gpu_renderer_register[local_14].id.renderer)) {
      if (_gpu_renderer_register[local_14].createFn != (_func_GPU_Renderer_ptr_GPU_RendererID *)0x0)
      {
        in_stack_00000008 = _gpu_renderer_register[local_14].id.name;
        unique0x100000c0 = id;
        GVar1.name = in_stack_00000008;
        GVar1.major_version = id.name._4_4_;
        GVar1.minor_version = id.renderer;
        GVar1._20_4_ = id.major_version;
        pGStack_10 = (*_gpu_renderer_register[local_14].createFn)(GVar1);
      }
      goto LAB_0013b53d;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

GPU_Renderer* GPU_CreateRenderer(GPU_RendererID id)
{
	GPU_Renderer* result = NULL;
	int i;
	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer == GPU_RENDERER_UNKNOWN)
			continue;
		
		if(id.renderer == _gpu_renderer_register[i].id.renderer)
		{
			if(_gpu_renderer_register[i].createFn != NULL)
            {
                // Use the registered name
                id.name = _gpu_renderer_register[i].id.name;
				result = _gpu_renderer_register[i].createFn(id);
            }
			break;
		}
	}
	
	if(result == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Renderer was not found in the renderer registry.");
    }
	return result;
}